

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glmath.c
# Opt level: O3

void multiply(mat4 *m,mat4 *m1,mat4 *m2)

{
  int c;
  long lVar1;
  float *pfVar2;
  int r;
  ulong uVar3;
  long lVar4;
  float total;
  float fVar5;
  mat4 result;
  
  lVar1 = 0;
  do {
    uVar3 = 0;
    pfVar2 = m1->value;
    do {
      fVar5 = 0.0;
      lVar4 = 0;
      do {
        fVar5 = fVar5 + pfVar2[lVar4] * *(float *)((long)m2 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      result.value[uVar3 | lVar1 * 4] = fVar5;
      uVar3 = uVar3 + 1;
      pfVar2 = pfVar2 + 1;
    } while (uVar3 != 4);
    lVar1 = lVar1 + 1;
    m2 = (mat4 *)((long)m2 + 0x10);
  } while (lVar1 != 4);
  *(undefined8 *)(m->value + 0xc) = result.value._48_8_;
  *(undefined8 *)(m->value + 0xe) = result.value._56_8_;
  *(undefined8 *)(m->value + 8) = result.value._32_8_;
  *(undefined8 *)(m->value + 10) = result.value._40_8_;
  *(undefined8 *)(m->value + 4) = result.value._16_8_;
  *(undefined8 *)(m->value + 6) = result.value._24_8_;
  *(undefined8 *)m->value = result.value._0_8_;
  *(undefined8 *)(m->value + 2) = result.value._8_8_;
  return;
}

Assistant:

void multiply(mat4 *m, mat4 *m1, mat4 *m2)
{
    mat4 result;
    for (int c = 0; c < 4; c++) {
        for (int r = 0; r < 4; r++) {
            int index = c * 4 + r;
            float total = 0;
            for (int i = 0; i < 4; i++) {
                int p = i * 4 + r;
                int q = c * 4 + i;
                total += m1->value[p] * m2->value[q];
            }
            result.value[index] = total;
        }
    }
    *m = result;
}